

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  WebData paVar2;
  N_Vector cB_00;
  long lVar3;
  undefined8 uVar4;
  N_Vector in_RSI;
  N_Vector cB;
  sunrealtype abstolB;
  sunrealtype reltolB;
  int indexB;
  int ncheck;
  int retval;
  SUNLinearSolver LSB;
  SUNLinearSolver LS;
  void *cvode_mem;
  WebData wdata;
  N_Vector c;
  sunrealtype t;
  sunrealtype reltol;
  sunrealtype abstol;
  int opt;
  WebData wdata_00;
  undefined1 *returnvalue;
  int local_5c;
  uint local_58;
  undefined4 local_54;
  undefined8 local_50;
  undefined8 local_48;
  WebData paVar5;
  undefined1 local_28 [8];
  undefined1 *local_20;
  WebData wdata_01;
  int local_4;
  
  wdata_01 = (WebData)&DAT_3ee4f8b588e368f1;
  local_20 = &DAT_3ee4f8b588e368f1;
  returnvalue = &DAT_3ee4f8b588e368f1;
  wdata_00 = (WebData)&DAT_3ee4f8b588e368f1;
  paVar5 = (WebData)0x0;
  local_50 = 0;
  local_48 = 0;
  local_54 = SUNContext_Create(0,&sunctx);
  iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
  if (iVar1 == 0) {
    paVar2 = AllocUserData();
    iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
    if (iVar1 == 0) {
      InitUserData(paVar5);
      cB_00 = (N_Vector)N_VNew_Serial(0x961,sunctx);
      iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
      if (iVar1 == 0) {
        CInit(in_RSI,wdata_01);
        printf("\nCreate and allocate CVODES memory for forward run\n");
        paVar5 = (WebData)CVodeCreate(2,sunctx);
        iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
        if (iVar1 == 0) {
          paVar2->cvode_mem = paVar5;
          local_54 = CVodeSetUserData(paVar5,paVar2);
          iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
          if (iVar1 == 0) {
            local_54 = CVodeInit(0,paVar5,f,cB_00);
            iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
            if (iVar1 == 0) {
              local_54 = CVodeSStolerances(local_20,wdata_01,paVar5);
              iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
              if (iVar1 == 0) {
                local_48 = SUNLinSol_SPGMR(cB_00,1,0,sunctx);
                iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
                if (iVar1 == 0) {
                  local_54 = CVodeSetLinearSolver(paVar5,local_48,0);
                  iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
                  if (iVar1 == 0) {
                    local_54 = CVodeSetPreconditioner(paVar5,Precond,PSolve);
                    iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
                    if (iVar1 == 0) {
                      local_54 = CVodeSetMaxNumSteps(paVar5,0x9c4);
                      iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
                      if (iVar1 == 0) {
                        printf("\nAllocate global memory\n");
                        local_54 = CVodeAdjInit(paVar5,300,1);
                        iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
                        if (iVar1 == 0) {
                          printf("\nForward integration\n");
                          local_54 = CVodeF(0x4024000000000000,paVar5,cB_00,local_28,1,&local_58);
                          iVar1 = check_retval(returnvalue,(char *)wdata_00,0);
                          if (iVar1 == 0) {
                            printf("\nncheck = %d\n",(ulong)local_58);
                            lVar3 = N_VGetArrayPointer(cB_00);
                            printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %f \n\n",
                                   *(undefined8 *)(lVar3 + 0x4b00),6);
                            uVar4 = N_VNew_Serial(0x960,sunctx);
                            opt = (int)((ulong)uVar4 >> 0x20);
                            iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                            if (iVar1 == 0) {
                              N_VConst(0,uVar4);
                              printf("\nCreate and allocate CVODES memory for backward run\n");
                              local_54 = CVodeCreateB(paVar5,2,&local_5c);
                              iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                              if (iVar1 == 0) {
                                local_54 = CVodeSetUserDataB(paVar5,local_5c,paVar2);
                                iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                                if (iVar1 == 0) {
                                  local_54 = CVodeSetMaxNumStepsB(paVar5,local_5c,1000);
                                  iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                                  if (iVar1 == 0) {
                                    local_54 = CVodeInitB(0x4024000000000000,paVar5,local_5c,fB,
                                                          uVar4);
                                    iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                                    if (iVar1 == 0) {
                                      local_54 = CVodeSStolerancesB(returnvalue,wdata_00,paVar5,
                                                                    local_5c);
                                      iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                                      if (iVar1 == 0) {
                                        paVar2->indexB = local_5c;
                                        local_50 = SUNLinSol_SPGMR(uVar4,1,0,sunctx);
                                        iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                                        if (iVar1 == 0) {
                                          local_54 = CVodeSetLinearSolverB
                                                               (paVar5,local_5c,local_50,0);
                                          iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                                          if (iVar1 == 0) {
                                            local_54 = CVodeSetPreconditionerB
                                                                 (paVar5,local_5c,PrecondB,PSolveB);
                                            iVar1 = check_retval(returnvalue,(char *)wdata_00,opt);
                                            if (iVar1 == 0) {
                                              printf("\nBackward integration\n");
                                              local_54 = CVodeB(0,paVar5,1);
                                              iVar1 = check_retval(returnvalue,(char *)wdata_00,opt)
                                              ;
                                              if (iVar1 == 0) {
                                                local_54 = CVodeGetB(paVar5,local_5c,local_28,uVar4)
                                                ;
                                                iVar1 = check_retval(returnvalue,(char *)wdata_00,
                                                                     opt);
                                                if (iVar1 == 0) {
                                                  PrintOutput(cB_00,(int)((ulong)paVar2 >> 0x20),
                                                              (int)paVar2,paVar5);
                                                  CVodeFree(&stack0xffffffffffffffc0);
                                                  N_VDestroy(cB_00);
                                                  N_VDestroy(uVar4);
                                                  SUNLinSolFree(local_48);
                                                  SUNLinSolFree(local_50);
                                                  SUNContext_Free(&sunctx);
                                                  FreeUserData(wdata_00);
                                                  local_4 = 0;
                                                }
                                                else {
                                                  local_4 = 1;
                                                }
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol = ATOL, reltol = RTOL, t;
  N_Vector c;
  WebData wdata;
  void* cvode_mem;
  SUNLinearSolver LS, LSB;

  int retval, ncheck;

  int indexB;

  sunrealtype reltolB = RTOL, abstolB = ATOL;
  N_Vector cB;

  c         = NULL;
  cB        = NULL;
  wdata     = NULL;
  cvode_mem = NULL;
  LS = LSB = NULL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data */

  wdata = AllocUserData();
  if (check_retval((void*)wdata, "AllocUserData", 2)) { return (1); }
  InitUserData(wdata);

  /* Set-up forward problem */

  /* Initializations */
  c = N_VNew_Serial(NEQ + 1, sunctx);
  if (check_retval((void*)c, "N_VNew_Serial", 0)) { return (1); }
  CInit(c, wdata);

  /* Call CVodeCreate/CVodeInit for forward run */
  printf("\nCreate and allocate CVODES memory for forward run\n");
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }
  wdata->cvode_mem = cvode_mem; /* Used in Precond */
  retval           = CVodeSetUserData(cvode_mem, wdata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }
  retval = CVodeInit(cvode_mem, f, T0, c);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create SUNLinSol_SPGMR linear solver for forward run */
  LS = SUNLinSol_SPGMR(c, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* Call CVodeSetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = CVodeSetMaxNumSteps(cvode_mem, 2500);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Set-up adjoint calculations */

  printf("\nAllocate global memory\n");
  retval = CVodeAdjInit(cvode_mem, NSTEPS, CV_HERMITE);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */

  printf("\nForward integration\n");
  retval = CVodeF(cvode_mem, TOUT, c, &t, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("\nncheck = %d\n", ncheck);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %Lf \n\n", ISPEC,
         N_VGetArrayPointer(c)[NEQ]);
#else
  printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %f \n\n", ISPEC,
         N_VGetArrayPointer(c)[NEQ]);
#endif

  /* Set-up backward problem */

  /* Allocate cB */
  cB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)cB, "N_VNew_Serial", 0)) { return (1); }
  /* Initialize cB = 0 */
  N_VConst(ZERO, cB);

  /* Create and allocate CVODES memory for backward run */
  printf("\nCreate and allocate CVODES memory for backward run\n");
  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }
  retval = CVodeSetUserDataB(cvode_mem, indexB, wdata);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }
  retval = CVodeSetMaxNumStepsB(cvode_mem, indexB, 1000);
  if (check_retval(&retval, "CVodeSetMaxNumStepsB", 1)) { return (1); }
  retval = CVodeInitB(cvode_mem, indexB, fB, TOUT, cB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }
  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  wdata->indexB = indexB;

  /* Create SUNLinSol_SPGMR linear solver for backward run */
  LSB = SUNLinSol_SPGMR(cB, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditionerB(cvode_mem, indexB, PrecondB, PSolveB);
  if (check_retval(&retval, "CVodeSetPreconditionerB", 1)) { return (1); }

  /* Perform backward integration */

  printf("\nBackward integration\n");
  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &t, cB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  PrintOutput(cB, NS, MXNS, wdata);

  /* Free all memory */
  CVodeFree(&cvode_mem);

  N_VDestroy(c);
  N_VDestroy(cB);
  SUNLinSolFree(LS);
  SUNLinSolFree(LSB);
  SUNContext_Free(&sunctx);
  FreeUserData(wdata);

  return (0);
}